

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int fmt::v11::detail::get_dynamic_spec<fmt::v11::context>
              (arg_id_kind kind,arg_ref<char> *ref,context *ctx)

{
  unsigned_long_long uVar1;
  format_arg arg;
  dynamic_spec_getter local_29;
  format_arg local_28;
  
  if (kind == none) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/format.h"
                ,0xdd1,"");
  }
  if (kind == index) {
    basic_format_args<fmt::v11::context>::get(&local_28,&ctx->args_,ref->index);
  }
  else {
    basic_format_args<fmt::v11::context>::get<char>(&local_28,&ctx->args_,ref->name);
  }
  if (local_28.type_ != none_type) {
    uVar1 = basic_format_arg<fmt::v11::context>::visit<fmt::v11::detail::dynamic_spec_getter>
                      (&local_28,&local_29);
    if ((uVar1 & 0xffffffff80000000) == 0) {
      return (int)uVar1;
    }
    report_error("width/precision is out of range");
  }
  report_error("argument not found");
}

Assistant:

FMT_CONSTEXPR int get_dynamic_spec(
    arg_id_kind kind, const arg_ref<typename Context::char_type>& ref,
    Context& ctx) {
  FMT_ASSERT(kind != arg_id_kind::none, "");
  auto arg =
      kind == arg_id_kind::index ? ctx.arg(ref.index) : ctx.arg(ref.name);
  if (!arg) report_error("argument not found");
  unsigned long long value = arg.visit(dynamic_spec_getter());
  if (value > to_unsigned(max_value<int>()))
    report_error("width/precision is out of range");
  return static_cast<int>(value);
}